

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsInitialize(CVodeMem cv_mem)

{
  CVLsMem cvls_mem_00;
  bool bVar1;
  int iVar2;
  SUNMatrix p_Var3;
  CVodeMem in_RDI;
  int retval;
  CVLsMem cvls_mem;
  int local_4;
  
  if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0x580,"cvLsInitialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                   ,"Linear solver memory is NULL.");
    local_4 = -2;
  }
  else {
    cvls_mem_00 = (CVLsMem)in_RDI->cv_lmem;
    if (cvls_mem_00->A == (SUNMatrix)0x0) {
      cvls_mem_00->jacDQ = 0;
      cvls_mem_00->jac = (CVLsJacFn)0x0;
      cvls_mem_00->J_data = (void *)0x0;
      cvls_mem_00->user_linsys = 0;
      cvls_mem_00->linsys = (CVLsLinSysFn)0x0;
      cvls_mem_00->A_data = (void *)0x0;
    }
    else if (cvls_mem_00->user_linsys == 0) {
      cvls_mem_00->linsys = cvLsLinSys;
      cvls_mem_00->A_data = in_RDI;
      if (cvls_mem_00->jacDQ == 0) {
        cvls_mem_00->J_data = in_RDI->cv_user_data;
      }
      else {
        bVar1 = false;
        if (cvls_mem_00->A->ops->getid == (_func_SUNMatrix_ID_SUNMatrix *)0x0) {
          bVar1 = true;
        }
        else {
          iVar2 = SUNMatGetID(cvls_mem_00->A);
          if ((iVar2 == 0) || (iVar2 = SUNMatGetID(cvls_mem_00->A), iVar2 == 3)) {
            cvls_mem_00->jac = cvLsDQJac;
            cvls_mem_00->J_data = in_RDI;
          }
          else {
            bVar1 = true;
          }
        }
        if (bVar1) {
          cvProcessError(in_RDI,-3,0x5a9,"cvLsInitialize",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                         ,"No Jacobian constructor available for SUNMatrix type");
          cvls_mem_00->last_flag = -3;
          return -3;
        }
      }
      if (cvls_mem_00->savedJ == (SUNMatrix)0x0) {
        p_Var3 = (SUNMatrix)SUNMatClone(cvls_mem_00->A);
        cvls_mem_00->savedJ = p_Var3;
        if (cvls_mem_00->savedJ == (SUNMatrix)0x0) {
          cvProcessError(in_RDI,-4,0x5bb,"cvLsInitialize",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                         ,"A memory request failed.");
          cvls_mem_00->last_flag = -4;
          return -4;
        }
      }
    }
    else {
      cvls_mem_00->A_data = in_RDI->cv_user_data;
    }
    cvLsInitializeCounters(cvls_mem_00);
    if (cvls_mem_00->jtimesDQ == 0) {
      cvls_mem_00->jt_data = in_RDI->cv_user_data;
    }
    else {
      cvls_mem_00->jtsetup = (CVLsJacTimesSetupFn)0x0;
      cvls_mem_00->jtimes = cvLsDQJtimes;
      cvls_mem_00->jt_data = in_RDI;
    }
    if ((cvls_mem_00->A == (SUNMatrix)0x0) && (cvls_mem_00->pset == (CVLsPrecSetupFn)0x0)) {
      in_RDI->cv_lsetup =
           (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)0x0
      ;
    }
    iVar2 = SUNLinSolGetType(cvls_mem_00->LS);
    if (iVar2 == 3) {
      in_RDI->cv_lsetup =
           (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)0x0
      ;
      cvls_mem_00->scalesol = 0;
    }
    iVar2 = SUNLinSolInitialize(cvls_mem_00->LS);
    cvls_mem_00->last_flag = iVar2;
    local_4 = cvls_mem_00->last_flag;
  }
  return local_4;
}

Assistant:

int cvLsInitialize(CVodeMem cv_mem)
{
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Test for valid combinations of matrix & Jacobian routines: */
  if (cvls_mem->A != NULL)
  {
    /* Matrix-based case */

    if (cvls_mem->user_linsys)
    {
      /* User-supplied linear system function, reset A_data (just in case) */
      cvls_mem->A_data = cv_mem->cv_user_data;
    }
    else
    {
      /* Internal linear system function, reset pointers (just in case) */
      cvls_mem->linsys = cvLsLinSys;
      cvls_mem->A_data = cv_mem;

      /* Check if an internal or user-supplied Jacobian function is used */
      if (cvls_mem->jacDQ)
      {
        /* Internal difference quotient Jacobian. Check that A is dense or band,
           otherwise return an error */
        retval = 0;
        if (cvls_mem->A->ops->getid)
        {
          if ((SUNMatGetID(cvls_mem->A) == SUNMATRIX_DENSE) ||
              (SUNMatGetID(cvls_mem->A) == SUNMATRIX_BAND))
          {
            cvls_mem->jac    = cvLsDQJac;
            cvls_mem->J_data = cv_mem;
          }
          else { retval++; }
        }
        else { retval++; }
        if (retval)
        {
          cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                         __FILE__, "No Jacobian constructor available for SUNMatrix type");
          cvls_mem->last_flag = CVLS_ILL_INPUT;
          return (CVLS_ILL_INPUT);
        }
      }
      else
      {
        /* User-supplied Jacobian, reset J_data pointer (just in case) */
        cvls_mem->J_data = cv_mem->cv_user_data;
      }

      /* Allocate internally saved Jacobian if not already done */
      if (cvls_mem->savedJ == NULL)
      {
        cvls_mem->savedJ = SUNMatClone(cvls_mem->A);
        if (cvls_mem->savedJ == NULL)
        {
          cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                         MSG_LS_MEM_FAIL);
          cvls_mem->last_flag = CVLS_MEM_FAIL;
          return (CVLS_MEM_FAIL);
        }
      }

    } /* end matrix-based case */
  }
  else
  {
    /* Matrix-free case: ensure 'jac' and `linsys` function pointers are NULL */
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = NULL;
    cvls_mem->J_data = NULL;

    cvls_mem->user_linsys = SUNFALSE;
    cvls_mem->linsys      = NULL;
    cvls_mem->A_data      = NULL;
  }

  /* reset counters */
  cvLsInitializeCounters(cvls_mem);

  /* Set Jacobian-vector product related fields, based on jtimesDQ */
  if (cvls_mem->jtimesDQ)
  {
    cvls_mem->jtsetup = NULL;
    cvls_mem->jtimes  = cvLsDQJtimes;
    cvls_mem->jt_data = cv_mem;
  }
  else { cvls_mem->jt_data = cv_mem->cv_user_data; }

  /* if A is NULL and psetup is not present, then cvLsSetup does
     not need to be called, so set the lsetup function to NULL */
  if ((cvls_mem->A == NULL) && (cvls_mem->pset == NULL))
  {
    cv_mem->cv_lsetup = NULL;
  }

  /* When using a matrix-embedded linear solver, disable lsetup call and solution scaling */
  if (SUNLinSolGetType(cvls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    cv_mem->cv_lsetup  = NULL;
    cvls_mem->scalesol = SUNFALSE;
  }

  /* Call LS initialize routine, and return result */
  cvls_mem->last_flag = SUNLinSolInitialize(cvls_mem->LS);
  return (cvls_mem->last_flag);
}